

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator-
          (TPZFMatrix<long> *__return_storage_ptr__,TPZFMatrix<long> *this,TPZFMatrix<long> *A)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  
  if (((A->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow !=
       (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
     ((A->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
      (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) {
    Error("Operator- <matrixs with different dimensions>",(char *)0x0);
  }
  TPZFMatrix(__return_storage_ptr__,this);
  lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (0 < lVar3) {
    plVar2 = __return_storage_ptr__->fElem;
    plVar1 = plVar2 + lVar3;
    plVar4 = A->fElem;
    do {
      *plVar2 = *plVar2 - *plVar4;
      plVar4 = plVar4 + 1;
      plVar2 = plVar2 + 1;
    } while (plVar2 < plVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar>
TPZFMatrix<TVar>::operator-(const TPZFMatrix<TVar> &A ) const {

    if ( (A.Rows() != this->Rows())  ||  (A.Cols() != this->Cols()) )
        Error( "Operator- <matrixs with different dimensions>" );
    
    auto res (*this);
    TVar * pa = A.fElem;
    const auto size = this->Rows()*this->Cols();
    TVar * pr = res.fElem, *prlast =pr+size;
    
    while(pr < prlast) *pr++ -= (*pa++);
    return res;
}